

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

CoverCrossSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CoverCrossSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::CoverpointSymbol_const*,18446744073709551615ul>>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          span<const_slang::ast::CoverpointSymbol_*,_18446744073709551615UL> *args_3)

{
  string_view name;
  span<const_slang::ast::CoverpointSymbol_*const,_18446744073709551615UL> targets;
  CoverCrossSymbol *this_00;
  
  this_00 = (CoverCrossSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverCrossSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (CoverCrossSymbol *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  targets._M_ptr = args_3->_M_ptr;
  targets._M_extent._M_extent_value = (args_3->_M_extent)._M_extent_value;
  ast::CoverCrossSymbol::CoverCrossSymbol(this_00,args,name,*args_2,targets);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }